

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_load_fpr64(DisasContext_conflict6 *ctx,TCGv_i64 t,int reg)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  TCGv_i64 ret;
  TCGContext_conflict6 *tcg_ctx;
  
  ret = (TCGv_i64)CONCAT44(in_register_00000014,reg);
  if (((ulong)ctx & 0x40) == 0) {
    tcg_gen_deposit_i64_mips64el
              ((TCGContext_conflict6 *)t,ret,
               *(TCGv_i64 *)(t + (long)(int)(in_ECX & 0xfffffffe) * 8 + 0xb040),
               *(TCGv_i64 *)(t + (long)(int)(in_ECX | 1) * 8 + 0xb040),0x20,0x20);
    return;
  }
  if (*(TCGv_i64 *)(t + (long)(int)in_ECX * 8 + 0xb040) != ret) {
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)t,INDEX_op_mov_i64,(TCGArg)(ret + (long)t),
               (TCGArg)(*(TCGv_i64 *)(t + (long)(int)in_ECX * 8 + 0xb040) + (long)t));
    return;
  }
  return;
}

Assistant:

static void gen_load_fpr64(DisasContext *ctx, TCGv_i64 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        tcg_gen_mov_i64(tcg_ctx, t, tcg_ctx->fpu_f64[reg]);
    } else {
        tcg_gen_concat32_i64(tcg_ctx, t, tcg_ctx->fpu_f64[reg & ~1], tcg_ctx->fpu_f64[reg | 1]);
    }
}